

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::Entry::Entry(Entry *this,cmListFileContext *lfc,Entry *up)

{
  Entry *up_local;
  cmListFileContext *lfc_local;
  Entry *this_local;
  
  cmListFileContext::cmListFileContext(&this->super_cmListFileContext,lfc);
  this->Up = up;
  this->RefCount = 0;
  if (this->Up != (Entry *)0x0) {
    Ref(this->Up);
  }
  return;
}

Assistant:

Entry(cmListFileContext const& lfc, Entry* up)
    : cmListFileContext(lfc)
    , Up(up)
    , RefCount(0)
  {
    if (this->Up) {
      this->Up->Ref();
    }
  }